

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_iso9660.c
# Opt level: O0

int parseVolumeDescriptor
              (PHYSFS_Io *io,PHYSFS_uint64 *_rootpos,PHYSFS_uint64 *_rootlen,int *_joliet,
              int *_claimed)

{
  int iVar1;
  PHYSFS_uint32 PVar2;
  bool local_b6;
  bool local_b5;
  PHYSFS_uint8 *s;
  PHYSFS_uint32 local_a0;
  PHYSFS_uint32 datalen;
  PHYSFS_uint32 extent;
  PHYSFS_uint16 blocksize;
  PHYSFS_uint8 ignore [32];
  PHYSFS_uint8 escapeseqs [32];
  byte local_50;
  char local_4f;
  undefined1 local_4e [5];
  byte local_49;
  PHYSFS_uint8 flags;
  PHYSFS_uint8 version;
  PHYSFS_uint8 identifier [5];
  PHYSFS_uint8 type;
  int done;
  int found;
  PHYSFS_uint64 pos;
  int *_claimed_local;
  int *_joliet_local;
  PHYSFS_uint64 *_rootlen_local;
  PHYSFS_uint64 *_rootpos_local;
  PHYSFS_Io *io_local;
  
  _done = 0x8000;
  stack0xffffffffffffffbc = 0;
  _flags = 0;
  *_joliet = 0;
  while( true ) {
    while( true ) {
      if (_flags != 0) {
        if (stack0xffffffffffffffbc == 0) {
          PHYSFS_setErrorCode(PHYSFS_ERR_CORRUPT);
          return 0;
        }
        return 1;
      }
      iVar1 = (*io->seek)(io,_done);
      if (iVar1 == 0) {
        return 0;
      }
      _done = _done + 0x800;
      iVar1 = __PHYSFS_readAll(io,&local_49,1);
      if (iVar1 == 0) {
        return 0;
      }
      iVar1 = __PHYSFS_readAll(io,local_4e,5);
      if (iVar1 == 0) {
        return 0;
      }
      iVar1 = memcmp(local_4e,"CD001",5);
      if (iVar1 == 0) break;
      if (*_claimed == 0) {
        PHYSFS_setErrorCode(PHYSFS_ERR_UNSUPPORTED);
        return 0;
      }
    }
    *_claimed = 1;
    iVar1 = __PHYSFS_readAll(io,&local_4f,1);
    if (iVar1 == 0) {
      return 0;
    }
    if (local_4f != '\x01') {
      PHYSFS_setErrorCode(PHYSFS_ERR_UNSUPPORTED);
      return 0;
    }
    iVar1 = __PHYSFS_readAll(io,&local_50,1);
    if (iVar1 == 0) {
      return 0;
    }
    iVar1 = __PHYSFS_readAll(io,&extent,0x20);
    if (iVar1 == 0) {
      return 0;
    }
    iVar1 = __PHYSFS_readAll(io,&extent,0x20);
    if (iVar1 == 0) {
      return 0;
    }
    iVar1 = __PHYSFS_readAll(io,&extent,8);
    if (iVar1 == 0) {
      return 0;
    }
    iVar1 = __PHYSFS_readAll(io,&extent,4);
    if (iVar1 == 0) {
      return 0;
    }
    iVar1 = __PHYSFS_readAll(io,&extent,4);
    if (iVar1 == 0) {
      return 0;
    }
    iVar1 = __PHYSFS_readAll(io,ignore + 0x18,0x20);
    if (iVar1 == 0) {
      return 0;
    }
    iVar1 = __PHYSFS_readAll(io,&extent,2);
    if (iVar1 == 0) {
      return 0;
    }
    iVar1 = __PHYSFS_readAll(io,&extent,2);
    if (iVar1 == 0) {
      return 0;
    }
    iVar1 = __PHYSFS_readAll(io,&extent,2);
    if (iVar1 == 0) {
      return 0;
    }
    iVar1 = __PHYSFS_readAll(io,&extent,2);
    if (iVar1 == 0) {
      return 0;
    }
    iVar1 = __PHYSFS_readAll(io,(void *)((long)&datalen + 2),2);
    if (iVar1 == 0) {
      return 0;
    }
    iVar1 = __PHYSFS_readAll(io,&extent,2);
    if (iVar1 == 0) {
      return 0;
    }
    iVar1 = __PHYSFS_readAll(io,&extent,4);
    if (iVar1 == 0) {
      return 0;
    }
    iVar1 = __PHYSFS_readAll(io,&extent,4);
    if (iVar1 == 0) {
      return 0;
    }
    iVar1 = __PHYSFS_readAll(io,&extent,4);
    if (iVar1 == 0) {
      return 0;
    }
    iVar1 = __PHYSFS_readAll(io,&extent,4);
    if (iVar1 == 0) {
      return 0;
    }
    iVar1 = __PHYSFS_readAll(io,&extent,4);
    if (iVar1 == 0) {
      return 0;
    }
    iVar1 = __PHYSFS_readAll(io,&extent,4);
    if (iVar1 == 0) {
      return 0;
    }
    iVar1 = __PHYSFS_readAll(io,&extent,1);
    if (iVar1 == 0) {
      return 0;
    }
    iVar1 = __PHYSFS_readAll(io,&extent,1);
    if (iVar1 == 0) {
      return 0;
    }
    iVar1 = __PHYSFS_readAll(io,&local_a0,4);
    if (iVar1 == 0) {
      return 0;
    }
    iVar1 = __PHYSFS_readAll(io,&extent,4);
    if (iVar1 == 0) {
      return 0;
    }
    iVar1 = __PHYSFS_readAll(io,(void *)((long)&s + 4),4);
    if (iVar1 == 0) {
      return 0;
    }
    iVar1 = __PHYSFS_readAll(io,&extent,4);
    if (iVar1 == 0) {
      return 0;
    }
    PVar2 = PHYSFS_swapULE32((uint)datalen._2_2_);
    datalen._2_2_ = (ushort)PVar2;
    if ((datalen._2_2_ != 0) && (datalen._2_2_ != 0x800)) break;
    if (local_49 - 1 < 2) {
      if ((int)stack0xffffffffffffffbc < (int)(uint)local_49) {
        PVar2 = PHYSFS_swapULE32(local_a0);
        *_rootpos = (ulong)(PVar2 << 0xb);
        PVar2 = PHYSFS_swapULE32(s._4_4_);
        *_rootlen = (ulong)PVar2;
        register0x00000000 = (uint)local_49;
        if (register0x00000000 == 2) {
          local_b5 = false;
          if ((((local_50 & 1) == 0) && (local_b5 = false, ignore[0x18] == '%')) &&
             (local_b5 = false, ignore[0x19] == '/')) {
            local_b6 = true;
            if ((ignore[0x1a] != '@') && (local_b6 = true, ignore[0x1a] != 'C')) {
              local_b6 = ignore[0x1a] == 'E';
            }
            local_b5 = local_b6;
          }
          *_joliet = (uint)local_b5;
        }
      }
    }
    else if (local_49 == 0xff) {
      _flags = 1;
    }
  }
  PHYSFS_setErrorCode(PHYSFS_ERR_UNSUPPORTED);
  return 0;
}

Assistant:

static int parseVolumeDescriptor(PHYSFS_Io *io, PHYSFS_uint64 *_rootpos,
                                 PHYSFS_uint64 *_rootlen, int *_joliet,
                                 int *_claimed)
{
    PHYSFS_uint64 pos = 32768; /* start at the Primary Volume Descriptor */
    int found = 0;
    int done = 0;

    *_joliet = 0;

    while (!done)
    {
        PHYSFS_uint8 type;
        PHYSFS_uint8 identifier[5];
        PHYSFS_uint8 version;
        PHYSFS_uint8 flags;
        PHYSFS_uint8 escapeseqs[32];
        PHYSFS_uint8 ignore[32];
        PHYSFS_uint16 blocksize;
        PHYSFS_uint32 extent;
        PHYSFS_uint32 datalen;

        BAIL_IF_ERRPASS(!io->seek(io, pos), 0);
        pos += 2048;  /* each volume descriptor is 2048 bytes */

        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, &type, 1), 0);
        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, &identifier, 5), 0);

        if (memcmp(identifier, "CD001", 5) != 0)  /* maybe not an iso? */
        {
            BAIL_IF(!*_claimed, PHYSFS_ERR_UNSUPPORTED, 0);
            continue;  /* just skip this one */
        } /* if */

        *_claimed = 1; /* okay, this is probably an iso. */

        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, &version, 1), 0);  /* version */
        BAIL_IF(version != 1, PHYSFS_ERR_UNSUPPORTED, 0);

        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, &flags, 1), 0);
        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, ignore, 32), 0);  /* system id */
        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, ignore, 32), 0);  /* volume id */
        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, ignore, 8), 0);  /* reserved */
        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, ignore, 4), 0);  /* space le */
        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, ignore, 4), 0);  /* space be */
        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, escapeseqs, 32), 0);
        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, ignore, 2), 0);  /* setsize le */
        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, ignore, 2), 0);  /* setsize be */
        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, ignore, 2), 0);  /* seq num le */
        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, ignore, 2), 0);  /* seq num be */
        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, &blocksize, 2), 0);
        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, ignore, 2), 0); /* blocklen be */
        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, ignore, 4), 0); /* pthtablen le */
        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, ignore, 4), 0); /* pthtablen be */
        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, ignore, 4), 0); /* pthtabpos le */
        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, ignore, 4), 0); /* optpthtabpos le */
        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, ignore, 4), 0); /* pthtabpos be */
        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, ignore, 4), 0); /* optpthtabpos be */

        /* root directory record... */
        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, ignore, 1), 0); /* len */
        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, ignore, 1), 0); /* attr len */
        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, &extent, 4), 0);
        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, ignore, 4), 0); /* extent be */
        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, &datalen, 4), 0);
        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, ignore, 4), 0); /* datalen be */

        /* !!! FIXME: deal with this properly. */
        blocksize = PHYSFS_swapULE32(blocksize);
        BAIL_IF(blocksize && (blocksize != 2048), PHYSFS_ERR_UNSUPPORTED, 0);

        switch (type)
        {
            case 1:  /* Primary Volume Descriptor */
            case 2:  /* Supplementary Volume Descriptor */
                if (found < type)
                {
                    *_rootpos = PHYSFS_swapULE32(extent) * 2048;
                    *_rootlen = PHYSFS_swapULE32(datalen);
                    found = type;

                    if (found == 2)  /* possible Joliet volume */
                    {
                        const PHYSFS_uint8 *s = escapeseqs;
                        *_joliet = !(flags & 1) &&
                            (s[0] == 0x25) && (s[1] == 0x2F) &&
                            ((s[2] == 0x40) || (s[2] == 0x43) || (s[2] == 0x45));
                    } /* if */
                } /* if */
                break;

            case 255: /* type 255 terminates the volume descriptor list */
                done = 1;
                break;

            default:
                break;  /* skip unknown types. */
        } /* switch */
    } /* while */

    BAIL_IF(!found, PHYSFS_ERR_CORRUPT, 0);

    return 1;
}